

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KnotAli.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *fname;
  ostream *poVar3;
  size_type sVar4;
  undefined8 uVar5;
  reference pvVar6;
  istringstream ss;
  string final;
  double energy;
  string seq_2;
  string consensus;
  int i;
  ofstream out;
  string structure;
  string *seq_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  string *seq;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  int n_seq;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seqs2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  seqs;
  int dangles;
  string file;
  string output_file_k;
  string input_type;
  bool verbose;
  string input_file;
  args_info args_info;
  string *in_stack_00000910;
  string *in_stack_00000918;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000920;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000928;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000930;
  ostream *in_stack_fffffffffffff868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff870;
  string *in_stack_fffffffffffff880;
  string *in_stack_fffffffffffff888;
  allocator<char> *in_stack_fffffffffffff8a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  char *in_stack_fffffffffffff8a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8b0;
  reference in_stack_fffffffffffff8b8;
  string *in_stack_fffffffffffff8f0;
  int local_700;
  string local_6f0 [32];
  istringstream local_6d0 [384];
  string local_550 [32];
  string local_530 [32];
  string local_510 [32];
  string local_4f0 [32];
  string local_4d0 [32];
  string local_4b0 [32];
  string local_490 [32];
  double local_470;
  string local_468 [32];
  string local_448 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbd8;
  string local_408 [24];
  string *in_stack_fffffffffffffc10;
  string *in_stack_fffffffffffffc18;
  int local_3c4;
  ostream local_3c0 [52];
  int in_stack_fffffffffffffc74;
  double *in_stack_fffffffffffffc78;
  string *in_stack_fffffffffffffc80;
  string *in_stack_fffffffffffffc88;
  string local_1c0 [32];
  reference local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_198;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_190;
  undefined1 *local_188;
  reference local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_170;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_168;
  uint local_15c;
  undefined1 local_158 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  int local_110;
  byte local_10a;
  allocator<char> local_109;
  string local_108 [32];
  string local_e8 [32];
  string local_c8 [35];
  byte local_a5;
  string local_98 [96];
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  undefined8 *local_20;
  int local_18;
  int local_4;
  
  local_4 = 0;
  iVar2 = cmdline_parser((int)((ulong)in_stack_fffffffffffff870 >> 0x20),
                         (char **)in_stack_fffffffffffff868,(args_info *)0x13163d);
  if (iVar2 != 0) {
    exit(1);
  }
  std::__cxx11::string::string(local_98);
  if (local_18 == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_98);
  }
  else {
    std::__cxx11::string::operator=(local_98,(char *)*local_20);
  }
  local_a5 = local_38 != 0;
  std::__cxx11::string::string(local_c8);
  if (local_34 == 0) {
    std::__cxx11::string::operator=(local_c8,"FASTA");
  }
  else {
    std::__cxx11::string::operator=(local_c8,(string *)&type_abi_cxx11_);
  }
  std::__cxx11::string::string(local_e8);
  if (local_30 == 0) {
    std::__cxx11::string::operator=(local_e8,"results.afa");
  }
  else {
    std::__cxx11::string::operator=(local_e8,(string *)&output_file_abi_cxx11_);
  }
  local_10a = 0;
  if (local_28 == 0) {
    std::allocator<char>::allocator();
    local_10a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0);
  }
  else {
    std::__cxx11::string::string(local_108,(string *)&parameter_file_abi_cxx11_);
  }
  if ((local_10a & 1) != 0) {
    std::allocator<char>::~allocator(&local_109);
  }
  bVar1 = exists(in_stack_fffffffffffff8f0);
  if (bVar1) {
    fname = (char *)std::__cxx11::string::c_str();
    vrna_params_load(fname,0);
  }
  if (local_2c == 0) {
    local_700 = 2;
  }
  else {
    local_700 = dangle_model;
  }
  local_110 = local_700;
  cmdline_parser_free((args_info *)0x1318d7);
  bVar1 = exists(in_stack_fffffffffffff8f0);
  if (bVar1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x13194b);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x13195d);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x131972);
    updateVectors(in_stack_00000930,in_stack_00000928,in_stack_00000920,in_stack_00000918,
                  in_stack_00000910);
    sVar4 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_128);
    local_15c = (uint)sVar4;
    local_168 = &local_128;
    local_170._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff868);
    local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff868);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff870,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff868), bVar1) {
      local_180 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_170);
      seqtoRNA(in_stack_fffffffffffff880);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_170);
    }
    local_188 = local_158 + 0x18;
    local_190._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffff868);
    local_198 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff868);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff870,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff868), bVar1) {
      local_1a0 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_190);
      seqtoRNA(in_stack_fffffffffffff880);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_190);
    }
    MIVector(in_stack_fffffffffffffbd8);
    if ((local_a5 & 1) != 0) {
      printf("\t The number of sequences are %d\n",(ulong)local_15c);
      uVar5 = std::__cxx11::string::c_str();
      printf("\t The structure found through covariation of the alignment is: \n\n%s\n",uVar5);
    }
    std::ofstream::ofstream(local_3c0,local_e8,_S_trunc);
    for (local_3c4 = 0; local_3c4 < (int)local_15c; local_3c4 = local_3c4 + 1) {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&local_128,(long)local_3c4);
      std::__cxx11::string::string(local_408,(string *)pvVar6);
      std::__cxx11::string::string((string *)&stack0xfffffffffffffbd8,local_1c0);
      returnUngapped(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffbd8);
      std::__cxx11::string::~string(local_408);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(local_158 + 0x18),(long)local_3c4);
      std::__cxx11::string::string(local_468,(string *)pvVar6);
      removeIUPAC(in_stack_fffffffffffff888);
      std::__cxx11::string::~string(local_468);
      std::__cxx11::string::string(local_4b0,local_448);
      std::__cxx11::string::string(local_4d0,(string *)&stack0xfffffffffffffc18);
      Iterative_Fold(in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,
                     in_stack_fffffffffffffc74);
      std::__cxx11::string::~string(local_4d0);
      std::__cxx11::string::~string(local_4b0);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_158,(long)local_3c4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_158,(long)local_3c4);
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_4f0,(ulong)pvVar6);
      bVar1 = std::operator==(in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      std::__cxx11::string::~string(local_4f0);
      if (bVar1) {
        in_stack_fffffffffffff8b0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158;
        in_stack_fffffffffffff8b8 =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffff8b0,(long)local_3c4);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff8b0,(long)local_3c4);
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_510,(ulong)in_stack_fffffffffffff8b8);
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_158,(long)local_3c4);
        std::__cxx11::string::operator=((string *)pvVar6,local_510);
        std::__cxx11::string::~string(local_510);
      }
      this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_158;
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](this,(long)local_3c4);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](this,(long)local_3c4);
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_530,(ulong)pvVar6);
      bVar1 = std::operator==(in_stack_fffffffffffff870,(char *)in_stack_fffffffffffff868);
      std::__cxx11::string::~string(local_530);
      if (bVar1) {
        in_stack_fffffffffffff888 = (string *)local_158;
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)in_stack_fffffffffffff888,(long)local_3c4);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff888,(long)local_3c4);
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_550,(ulong)pvVar6);
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_158,(long)local_3c4);
        std::__cxx11::string::operator=((string *)pvVar6,local_550);
        std::__cxx11::string::~string(local_550);
      }
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_158,(long)local_3c4);
      std::__cxx11::istringstream::istringstream(local_6d0,(string *)pvVar6,_S_in);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_158,(long)local_3c4);
      std::operator>>((istream *)local_6d0,(string *)pvVar6);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_158,(long)local_3c4);
      std::operator+((char *)in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0);
      in_stack_fffffffffffff880 = (string *)std::operator<<(local_3c0,local_6f0);
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffff880,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_6f0);
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(local_158 + 0x18),(long)local_3c4);
      poVar3 = std::operator<<(local_3c0,(string *)pvVar6);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      in_stack_fffffffffffff870 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::operator<<(local_3c0,local_490);
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffff870,std::endl<char,std::char_traits<char>>);
      in_stack_fffffffffffff868 = (ostream *)std::ostream::operator<<(local_3c0,local_470);
      std::ostream::operator<<(in_stack_fffffffffffff868,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(local_3c0,std::endl<char,std::char_traits<char>>);
      std::__cxx11::istringstream::~istringstream(local_6d0);
      std::__cxx11::string::~string(local_490);
      std::__cxx11::string::~string(local_448);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffc18);
    }
    std::ofstream::close();
    local_4 = 0;
    std::ofstream::~ofstream(local_3c0);
    std::__cxx11::string::~string(local_1c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff880);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff880);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffff880);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_c8);
    std::__cxx11::string::~string(local_98);
    return local_4;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Input File does not exist!");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

int main(int argc, char *argv[]) {


    args_info args_info;

	// get options (call gengetopt command line parser)
	if (cmdline_parser (argc, argv, &args_info) != 0) {
	exit(1);
	}

	std::string input_file;
	if (args_info.inputs_num>0) {
	input_file=args_info.inputs[0];
	} else {
	std::getline(std::cin,input_file);
	}
    bool verbose;
	verbose = args_info.verbose_given;

    // bool stacking;
    // stacking = args_info.stacking_given;

    std::string input_type;
    args_info.input_type_given ? input_type = type : input_type = "FASTA";

    std::string output_file_k;
    args_info.output_file_given ? output_file_k = output_file : output_file_k = "results.afa";

    std::string file= args_info.paramFile_given ? parameter_file : "params/rna_DirksPierce09.par";
	if(exists(file)){
		vrna_params_load(file.c_str(), VRNA_PARAMETER_FORMAT_DEFAULT);
	}

    int dangles = args_info.dangles_given ? dangle_model : 2;

    cmdline_parser_free(&args_info);

    if(!exists(input_file)){
        std::cout << "Input File does not exist!" << std::endl;
        exit (EXIT_FAILURE);
    }



    // Define the data structures for the sequences
    std::vector <std::string> seqs;
    std::vector <std::string> seqs2;
    std::vector <std::string> names;

    updateVectors(seqs,seqs2,names,input_file, input_type);

    // number of sequences
    int n_seq = seqs.size();

    // Converts any possible T's to U's in the sequences
    for(std::string &seq : seqs) seqtoRNA(seq);
    for(std::string &seq : seqs2) seqtoRNA(seq);

    // Uses covariation/ Mutual Information to find probable structurally important base pairs
    std::string structure = MIVector(seqs);

    if(verbose){
      printf ("\t The number of sequences are %d\n", n_seq);
      printf ("\t The structure found through covariation of the alignment is: \n\n%s\n", structure.c_str());  
    }
    
    // The output file
    std::ofstream out(output_file_k, std::ofstream::trunc);
    for(int i=0; i<n_seq; ++i){
    
        std::string consensus = returnUngapped(seqs[i],structure);
        std::string seq = removeIUPAC(seqs2[i]);
        double energy;        

        std::string final = Iterative_Fold(seq,consensus, energy, dangles);
    
        // makes sure name is in correct format
        if(names[i].substr(names[i].length()-4,4) == ".seq") names[i] = names[i].substr(0,names[i].length()-4);
        if(names[i].substr(names[i].length()-3,3) == ".ct") names[i] = names[i].substr(0,names[i].length()-3);
        std::istringstream ss(names[i]);
        ss >> names[i];

        /**   Outputting to file     **/
        out << ">" + names[i] << std::endl;
        out << seqs2[i] << std::endl;
        out << final << std::endl;
        out << energy << std::endl;
        out << std::endl;
    }
    out.close();
    
    return 0;
}